

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O0

void com_deblock_set_edge(com_core_t *core)

{
  int i_scu_00;
  int iVar1;
  com_seqh_t *pcVar2;
  s8 *psVar3;
  u8 *puVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  uint scu_x_00;
  uint scu_y_00;
  int iVar8;
  com_map_t *map_00;
  com_ref_pic_t (*refp_00) [2];
  s8 (*pasVar9) [2];
  s8 (*pasVar10) [2];
  s16 (*paasVar11) [2] [2];
  s16 (*paasVar12) [2] [2];
  uint uVar13;
  com_pic_t *local_420;
  com_pic_t *local_418;
  com_pic_t *local_410;
  com_pic_t *local_408;
  com_pic_t *local_3f8;
  com_pic_t *local_3f0;
  com_pic_t *local_3e8;
  com_pic_t *local_3e0;
  com_ref_pic_t (*refp) [2];
  u8 *edge;
  com_scu_t scu;
  com_scu_t mask;
  int grad_mask;
  int scu_y;
  int scu_x;
  int scu_h;
  int scu_w;
  int lcu_idx;
  int scup;
  int i_scu;
  s8 *patch_idx;
  com_map_t *map;
  com_seqh_t *seqhdr;
  com_core_t *core_local;
  int grad_mask_7;
  byte *local_2c0;
  int grad_mask_3;
  byte *local_2a0;
  int grad_mask_2;
  byte *local_280;
  int grad_mask_1;
  byte *local_260;
  int grad_mask_8;
  byte *local_240;
  int grad_mask_6;
  byte *local_220;
  int grad_mask_5;
  byte *local_200;
  int grad_mask_4;
  byte *local_1e0;
  int local_1d0;
  byte *local_1c8;
  int local_1b8;
  byte *local_1b0;
  com_pic_t *p_pic1;
  com_pic_t *p_pic0;
  s8 *refi_p;
  u8 *edge_filter;
  int scup_1;
  com_pic_t *p_pic1_1;
  com_pic_t *p_pic0_1;
  s8 *refi_p_1;
  u8 *edge_filter_1;
  int scup_2;
  s16 (*mv_q_3) [2];
  s16 (*mv_p_3) [2];
  s16 (*mv_q_2) [2];
  s16 (*mv_p_2) [2];
  s8 *refi_q_1;
  com_scu_t mask_2;
  com_pic_t *q_pic1_1;
  com_pic_t *q_pic0_1;
  com_scu_t MbQ_1;
  s16 (*mv_q_1) [2];
  s16 (*mv_p_1) [2];
  s16 (*mv_q) [2];
  s16 (*mv_p) [2];
  s8 *refi_q;
  com_scu_t mask_1;
  com_pic_t *q_pic1;
  com_pic_t *q_pic0;
  com_scu_t MbQ;
  
  pcVar2 = core->seqhdr;
  map_00 = &core->map;
  psVar3 = (core->map).map_patch;
  i_scu_00 = pcVar2->i_scu;
  iVar8 = core->cu_scup;
  iVar7 = core->lcu_y * pcVar2->pic_width_in_lcu + core->lcu_x;
  scup_1 = core->cu_width >> 2;
  scup_2 = core->cu_height >> 2;
  scu_x_00 = core->cu_pix_x >> 2;
  scu_y_00 = core->cu_pix_y >> 2;
  if (((byte)(core->map).map_scu[iVar8] & 0x12) == 0) {
    refp_00 = core->refp;
    iVar8 = core->tb_part;
    if (iVar8 == 5) {
      if ((scu_y_00 + scup_2 / 2 & 1) == 0) {
        com_df_set_edge_hor(map_00,i_scu_00,refp_00,scu_x_00,scu_y_00 + scup_2 / 2,scup_1,1);
      }
      if ((scu_x_00 + scup_1 / 2 & 1) == 0) {
        com_df_set_edge_ver(map_00,i_scu_00,refp_00,scu_x_00 + scup_1 / 2,scu_y_00,scup_2,1);
      }
    }
    else if (iVar8 == 6) {
      if ((scu_y_00 + scup_2 / 4 & 1) == 0) {
        com_df_set_edge_hor(map_00,i_scu_00,refp_00,scu_x_00,scu_y_00 + scup_2 / 4,scup_1,1);
      }
      if ((scu_y_00 + scup_2 / 2 & 1) == 0) {
        com_df_set_edge_hor(map_00,i_scu_00,refp_00,scu_x_00,scu_y_00 + scup_2 / 2,scup_1,1);
      }
      if ((scu_y_00 + (scup_2 / 4) * 3 & 1) == 0) {
        com_df_set_edge_hor(map_00,i_scu_00,refp_00,scu_x_00,scu_y_00 + (scup_2 / 4) * 3,scup_1,1);
      }
    }
    else if (iVar8 == 7) {
      if ((scu_x_00 + scup_1 / 4 & 1) == 0) {
        com_df_set_edge_ver(map_00,i_scu_00,refp_00,scu_x_00 + scup_1 / 4,scu_y_00,scup_2,1);
      }
      if ((scu_x_00 + scup_1 / 2 & 1) == 0) {
        com_df_set_edge_ver(map_00,i_scu_00,refp_00,scu_x_00 + scup_1 / 2,scu_y_00,scup_2,1);
      }
      if ((scu_x_00 + (scup_1 / 4) * 3 & 1) == 0) {
        com_df_set_edge_ver(map_00,i_scu_00,refp_00,scu_x_00 + (scup_1 / 4) * 3,scu_y_00,scup_2,1);
      }
    }
    if (((scu_y_00 != 0) && ((scu_y_00 & 1) == 0)) &&
       ((core->cu_pix_y != core->lcu_pix_y ||
        ((pcVar2->cross_patch_loop_filter != '\0' ||
         (psVar3[iVar7] == psVar3[iVar7 - pcVar2->pic_width_in_lcu])))))) {
      edge_filter._4_4_ = scu_y_00 * i_scu_00 + scu_x_00;
      pasVar9 = (core->map).map_refi + edge_filter._4_4_;
      if ((*pasVar9)[0] < '\0') {
        local_3e0 = (com_pic_t *)0x0;
      }
      else {
        local_3e0 = refp_00[(*pasVar9)[0]][0].pic;
      }
      if ((*pasVar9)[1] < '\0') {
        local_3e8 = (com_pic_t *)0x0;
      }
      else {
        local_3e8 = refp_00[(*pasVar9)[1]][1].pic;
      }
      refi_p = (s8 *)((core->map).map_edge + edge_filter._4_4_);
      while (scup_1 != 0) {
        iVar8 = -i_scu_00;
        if (((byte)(core->map).map_scu[edge_filter._4_4_ + iVar8] & 0x12) == 0) {
          pasVar10 = (core->map).map_refi + (edge_filter._4_4_ + iVar8);
          if (*pasVar9 == *pasVar10) {
            paasVar11 = (core->map).map_mv + edge_filter._4_4_;
            paasVar12 = (core->map).map_mv + (edge_filter._4_4_ + iVar8);
            if ((*pasVar9)[0] < '\0') {
LAB_0011dd93:
              if ((*pasVar9)[1] < '\0') {
LAB_0011ddea:
                bVar5 = true;
              }
              else {
                iVar8 = (int)(*paasVar11)[1][0] - (int)(*paasVar12)[1][0];
                if (iVar8 < 1) {
                  iVar8 = -iVar8;
                }
                if (iVar8 < 4) {
                  iVar8 = (int)(*paasVar11)[1][1] - (int)(*paasVar12)[1][1];
                  if (iVar8 < 1) {
                    iVar8 = -iVar8;
                  }
                  if (iVar8 < 4) goto LAB_0011ddea;
                }
                bVar5 = false;
              }
            }
            else {
              iVar8 = (int)(*paasVar11)[0][0] - (int)(*paasVar12)[0][0];
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              if (iVar8 < 4) {
                iVar8 = (int)(*paasVar11)[0][1] - (int)(*paasVar12)[0][1];
                if (iVar8 < 1) {
                  iVar8 = -iVar8;
                }
                if (iVar8 < 4) goto LAB_0011dd93;
              }
              bVar5 = false;
            }
          }
          else {
            if ((*pasVar10)[0] < '\0') {
              local_3f0 = (com_pic_t *)0x0;
            }
            else {
              local_3f0 = refp_00[(*pasVar10)[0]][0].pic;
            }
            if ((*pasVar10)[1] < '\0') {
              local_3f8 = (com_pic_t *)0x0;
            }
            else {
              local_3f8 = refp_00[(*pasVar10)[1]][1].pic;
            }
            if ((local_3e0 == local_3f8) && (local_3e8 == local_3f0)) {
              paasVar11 = (core->map).map_mv + edge_filter._4_4_;
              paasVar12 = (core->map).map_mv + (edge_filter._4_4_ + iVar8);
              if ((*pasVar9)[0] < '\0') {
LAB_0011df1c:
                if ((*pasVar9)[1] < '\0') {
LAB_0011df6f:
                  bVar5 = true;
                }
                else {
                  iVar8 = (int)(*paasVar11)[1][0] - (int)(*paasVar12)[0][0];
                  if (iVar8 < 1) {
                    iVar8 = -iVar8;
                  }
                  if (iVar8 < 4) {
                    iVar8 = (int)(*paasVar11)[1][1] - (int)(*paasVar12)[0][1];
                    if (iVar8 < 1) {
                      iVar8 = -iVar8;
                    }
                    if (iVar8 < 4) goto LAB_0011df6f;
                  }
                  bVar5 = false;
                }
              }
              else {
                iVar8 = (int)(*paasVar11)[0][0] - (int)(*paasVar12)[1][0];
                if (iVar8 < 1) {
                  iVar8 = -iVar8;
                }
                if (iVar8 < 4) {
                  iVar8 = (int)(*paasVar11)[0][1] - (int)(*paasVar12)[1][1];
                  if (iVar8 < 1) {
                    iVar8 = -iVar8;
                  }
                  if (iVar8 < 4) goto LAB_0011df1c;
                }
                bVar5 = false;
              }
            }
            else {
              bVar5 = false;
            }
          }
        }
        else {
          bVar5 = false;
        }
        bVar6 = 0xc;
        if (bVar5) {
          bVar6 = 0;
        }
        *refi_p = *refi_p | bVar6;
        refi_p = refi_p + 1;
        edge_filter._4_4_ = edge_filter._4_4_ + 1;
        scup_1 = scup_1 + -1;
      }
    }
    if (((scu_x_00 != 0) && ((scu_x_00 & 1) == 0)) &&
       ((core->cu_pix_x != core->lcu_pix_x ||
        ((pcVar2->cross_patch_loop_filter != '\0' || (psVar3[iVar7] == psVar3[iVar7 + -1])))))) {
      edge_filter_1._4_4_ = scu_y_00 * i_scu_00 + scu_x_00;
      refi_p_1 = (s8 *)((core->map).map_edge + edge_filter_1._4_4_);
      pasVar9 = (core->map).map_refi + edge_filter_1._4_4_;
      if ((*pasVar9)[0] < '\0') {
        local_408 = (com_pic_t *)0x0;
      }
      else {
        local_408 = refp_00[(*pasVar9)[0]][0].pic;
      }
      if ((*pasVar9)[1] < '\0') {
        local_410 = (com_pic_t *)0x0;
      }
      else {
        local_410 = refp_00[(*pasVar9)[1]][1].pic;
      }
      while (scup_2 != 0) {
        if (((byte)(core->map).map_scu[edge_filter_1._4_4_ + -1] & 0x12) == 0) {
          pasVar10 = (core->map).map_refi + (edge_filter_1._4_4_ + -1);
          if (*pasVar9 == *pasVar10) {
            paasVar11 = (core->map).map_mv + edge_filter_1._4_4_;
            paasVar12 = (core->map).map_mv + (edge_filter_1._4_4_ + -1);
            if ((*pasVar9)[0] < '\0') {
LAB_0011e344:
              if ((*pasVar9)[1] < '\0') {
LAB_0011e3ad:
                bVar5 = true;
              }
              else {
                iVar8 = (int)(*paasVar11)[1][0] - (int)(*paasVar12)[1][0];
                if (iVar8 < 1) {
                  iVar8 = -iVar8;
                }
                if (iVar8 < 4) {
                  iVar8 = (int)(*paasVar11)[1][1] - (int)(*paasVar12)[1][1];
                  if (iVar8 < 1) {
                    iVar8 = -iVar8;
                  }
                  if (iVar8 < 4) goto LAB_0011e3ad;
                }
                bVar5 = false;
              }
            }
            else {
              iVar8 = (int)(*paasVar11)[0][0] - (int)(*paasVar12)[0][0];
              if (iVar8 < 1) {
                iVar8 = -iVar8;
              }
              if (iVar8 < 4) {
                iVar8 = (int)(*paasVar11)[0][1] - (int)(*paasVar12)[0][1];
                if (iVar8 < 1) {
                  iVar8 = -iVar8;
                }
                if (iVar8 < 4) goto LAB_0011e344;
              }
              bVar5 = false;
            }
          }
          else {
            if ((*pasVar10)[0] < '\0') {
              local_418 = (com_pic_t *)0x0;
            }
            else {
              local_418 = refp_00[(*pasVar10)[0]][0].pic;
            }
            if ((*pasVar10)[1] < '\0') {
              local_420 = (com_pic_t *)0x0;
            }
            else {
              local_420 = refp_00[(*pasVar10)[1]][1].pic;
            }
            if ((local_408 == local_420) && (local_410 == local_418)) {
              paasVar11 = (core->map).map_mv + edge_filter_1._4_4_;
              paasVar12 = (core->map).map_mv + (edge_filter_1._4_4_ + -1);
              if ((*pasVar9)[0] < '\0') {
LAB_0011e52d:
                if ((*pasVar9)[1] < '\0') {
LAB_0011e592:
                  bVar5 = true;
                }
                else {
                  iVar8 = (int)(*paasVar11)[1][0] - (int)(*paasVar12)[0][0];
                  if (iVar8 < 1) {
                    iVar8 = -iVar8;
                  }
                  if (iVar8 < 4) {
                    iVar8 = (int)(*paasVar11)[1][1] - (int)(*paasVar12)[0][1];
                    if (iVar8 < 1) {
                      iVar8 = -iVar8;
                    }
                    if (iVar8 < 4) goto LAB_0011e592;
                  }
                  bVar5 = false;
                }
              }
              else {
                iVar8 = (int)(*paasVar11)[0][0] - (int)(*paasVar12)[1][0];
                if (iVar8 < 1) {
                  iVar8 = -iVar8;
                }
                if (iVar8 < 4) {
                  iVar8 = (int)(*paasVar11)[0][1] - (int)(*paasVar12)[1][1];
                  if (iVar8 < 1) {
                    iVar8 = -iVar8;
                  }
                  if (iVar8 < 4) goto LAB_0011e52d;
                }
                bVar5 = false;
              }
            }
            else {
              bVar5 = false;
            }
          }
        }
        else {
          bVar5 = false;
        }
        if (bVar5) {
          bVar6 = 0;
        }
        else {
          bVar6 = 3;
        }
        *refi_p_1 = *refi_p_1 | bVar6;
        refi_p_1 = refi_p_1 + i_scu_00;
        edge_filter_1._4_4_ = i_scu_00 + edge_filter_1._4_4_;
        scup_2 = scup_2 + -1;
      }
    }
  }
  else {
    puVar4 = (core->map).map_edge;
    iVar1 = core->tb_part;
    if (iVar1 == 5) {
      uVar13 = scu_y_00 + scup_2 / 2;
      if ((uVar13 & 1) == 0) {
        grad_mask_7 = scup_1;
        local_2c0 = puVar4 + (int)(uVar13 * i_scu_00 + scu_x_00);
        while (grad_mask_7 != 0) {
          *local_2c0 = *local_2c0 | 4;
          grad_mask_7 = grad_mask_7 + -1;
          local_2c0 = local_2c0 + 1;
        }
      }
      uVar13 = scu_x_00 + scup_1 / 2;
      if ((uVar13 & 1) == 0) {
        local_240 = puVar4 + (int)(scu_y_00 * i_scu_00 + uVar13);
        grad_mask_8 = scup_2;
        while (grad_mask_8 != 0) {
          *local_240 = *local_240 | 1;
          local_240 = local_240 + i_scu_00;
          grad_mask_8 = grad_mask_8 + -1;
        }
      }
    }
    else if (iVar1 == 6) {
      uVar13 = scu_y_00 + scup_2 / 4;
      if ((uVar13 & 1) == 0) {
        grad_mask_1 = scup_1;
        local_260 = puVar4 + (int)(uVar13 * i_scu_00 + scu_x_00);
        while (grad_mask_1 != 0) {
          *local_260 = *local_260 | 4;
          grad_mask_1 = grad_mask_1 + -1;
          local_260 = local_260 + 1;
        }
      }
      uVar13 = scu_y_00 + scup_2 / 2;
      if ((uVar13 & 1) == 0) {
        grad_mask_2 = scup_1;
        local_280 = puVar4 + (int)(uVar13 * i_scu_00 + scu_x_00);
        while (grad_mask_2 != 0) {
          *local_280 = *local_280 | 4;
          grad_mask_2 = grad_mask_2 + -1;
          local_280 = local_280 + 1;
        }
      }
      uVar13 = scu_y_00 + (scup_2 / 4) * 3;
      if ((uVar13 & 1) == 0) {
        grad_mask_3 = scup_1;
        local_2a0 = puVar4 + (int)(uVar13 * i_scu_00 + scu_x_00);
        while (grad_mask_3 != 0) {
          *local_2a0 = *local_2a0 | 4;
          grad_mask_3 = grad_mask_3 + -1;
          local_2a0 = local_2a0 + 1;
        }
      }
    }
    else if (iVar1 == 7) {
      uVar13 = scu_x_00 + scup_1 / 4;
      if ((uVar13 & 1) == 0) {
        local_1e0 = puVar4 + (int)(scu_y_00 * i_scu_00 + uVar13);
        grad_mask_4 = scup_2;
        while (grad_mask_4 != 0) {
          *local_1e0 = *local_1e0 | 1;
          local_1e0 = local_1e0 + i_scu_00;
          grad_mask_4 = grad_mask_4 + -1;
        }
      }
      uVar13 = scu_x_00 + scup_1 / 2;
      if ((uVar13 & 1) == 0) {
        local_200 = puVar4 + (int)(scu_y_00 * i_scu_00 + uVar13);
        grad_mask_5 = scup_2;
        while (grad_mask_5 != 0) {
          *local_200 = *local_200 | 1;
          local_200 = local_200 + i_scu_00;
          grad_mask_5 = grad_mask_5 + -1;
        }
      }
      uVar13 = scu_x_00 + (scup_1 / 4) * 3;
      if ((uVar13 & 1) == 0) {
        local_220 = puVar4 + (int)(scu_y_00 * i_scu_00 + uVar13);
        grad_mask_6 = scup_2;
        while (grad_mask_6 != 0) {
          *local_220 = *local_220 | 1;
          local_220 = local_220 + i_scu_00;
          grad_mask_6 = grad_mask_6 + -1;
        }
      }
    }
    if (((scu_y_00 != 0) && ((scu_y_00 & 1) == 0)) &&
       ((core->cu_pix_y != core->lcu_pix_y ||
        ((pcVar2->cross_patch_loop_filter != '\0' ||
         (psVar3[iVar7] == psVar3[iVar7 - pcVar2->pic_width_in_lcu])))))) {
      local_1d0 = scup_1;
      local_1c8 = puVar4 + iVar8;
      while (local_1d0 != 0) {
        *local_1c8 = *local_1c8 | 0xc;
        local_1d0 = local_1d0 + -1;
        local_1c8 = local_1c8 + 1;
      }
    }
    if (((scu_x_00 != 0) && ((scu_x_00 & 1) == 0)) &&
       ((core->cu_pix_x != core->lcu_pix_x ||
        ((pcVar2->cross_patch_loop_filter != '\0' || (psVar3[iVar7] == psVar3[iVar7 + -1])))))) {
      local_1b0 = puVar4 + iVar8;
      local_1b8 = scup_2;
      while (local_1b8 != 0) {
        *local_1b0 = *local_1b0 | 3;
        local_1b0 = local_1b0 + i_scu_00;
        local_1b8 = local_1b8 + -1;
      }
    }
  }
  return;
}

Assistant:

void com_deblock_set_edge(com_core_t *core)
{
    com_seqh_t *seqhdr = core->seqhdr;
    com_map_t *map = &core->map;
    s8 *patch_idx = map->map_patch;
    int i_scu = seqhdr->i_scu;
    int scup = core->cu_scup;
    int lcu_idx = core->lcu_y * seqhdr->pic_width_in_lcu + core->lcu_x;
    int scu_w = core->cu_width  >> MIN_CU_LOG2;
    int scu_h = core->cu_height >> MIN_CU_LOG2;
    int scu_x = core->cu_pix_x  >> MIN_CU_LOG2;
    int scu_y = core->cu_pix_y  >> MIN_CU_LOG2;
    const int grad_mask = (LOOPFILTER_GRID >> 2) - 1;
    const com_scu_t mask = { 0, 1, 0, 0, 1, 0, 0 };
    com_scu_t scu = map->map_scu[scup];

    if ((*(u8*)&scu) & (*(u8*)&mask)) {
        u8 *edge = map->map_edge;

        switch (core->tb_part) {
        case SIZE_2NxhN:
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 4 * 1, scu_w, EDGE_TYPE_LUMA);
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 2    , scu_w, EDGE_TYPE_LUMA);
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 4 * 3, scu_w, EDGE_TYPE_LUMA);
            break;                    
        case SIZE_hNx2N:              
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 4 * 1, scu_y, scu_h, EDGE_TYPE_LUMA);
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 2    , scu_y, scu_h, EDGE_TYPE_LUMA);
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 4 * 3, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;                    
        case SIZE_NxN:                
            com_df_set_edge_hor_force(edge, i_scu, scu_x, scu_y + scu_h / 2, scu_w, EDGE_TYPE_LUMA);
            com_df_set_edge_ver_force(edge, i_scu, scu_x + scu_w / 2, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;
        default:
            break;
        }
        if (scu_y && (scu_y & grad_mask) == 0 && (core->cu_pix_y != core->lcu_pix_y || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - seqhdr->pic_width_in_lcu])) {
            com_df_set_edge_hor_force_cu(edge + scup, i_scu, scu_w, EDGE_TYPE_ALL);  // UP
        }
        if (scu_x && (scu_x & grad_mask) == 0 && (core->cu_pix_x != core->lcu_pix_x || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - 1])) {
            com_df_set_edge_ver_force_cu(edge + scup, i_scu, scu_h, EDGE_TYPE_ALL);  // LEFT
        }

    } else {
        com_ref_pic_t(*refp)[REFP_NUM] = core->refp;

#define set_edge_hor(map, i_scu, refp, scu_x, scu_y, cu_w, flag) { if (((scu_y) & grad_mask) == 0)  com_df_set_edge_hor(map, i_scu, refp, scu_x, scu_y, cu_w, flag); }
#define set_edge_ver(map, i_scu, refp, scu_x, scu_y, cu_w, flag) { if (((scu_x) & grad_mask) == 0)  com_df_set_edge_ver(map, i_scu, refp, scu_x, scu_y, cu_w, flag); }
        
        switch (core->tb_part) {
        case SIZE_2NxhN:
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 4 * 1, scu_w, EDGE_TYPE_LUMA);
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 2    , scu_w, EDGE_TYPE_LUMA);
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 4 * 3, scu_w, EDGE_TYPE_LUMA);
            break;
        case SIZE_hNx2N:
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 4 * 1, scu_y, scu_h, EDGE_TYPE_LUMA);
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 2    , scu_y, scu_h, EDGE_TYPE_LUMA);
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 4 * 3, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;
        case SIZE_NxN:
            set_edge_hor(map, i_scu, refp, scu_x, scu_y + scu_h / 2, scu_w, EDGE_TYPE_LUMA);
            set_edge_ver(map, i_scu, refp, scu_x + scu_w / 2, scu_y, scu_h, EDGE_TYPE_LUMA);
            break;
        default:
            break;
        }
        
        if (scu_y && (scu_y & grad_mask) == 0 && (core->cu_pix_y != core->lcu_pix_y || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - seqhdr->pic_width_in_lcu])) {
            com_df_set_edge_hor_inline(map, i_scu, refp, scu_x, scu_y, scu_w, EDGE_TYPE_ALL);  // UP
        }
        if (scu_x && (scu_x & grad_mask) == 0 && (core->cu_pix_x != core->lcu_pix_x || seqhdr->cross_patch_loop_filter || patch_idx[lcu_idx] == patch_idx[lcu_idx - 1])) {
            com_df_set_edge_ver_inline(map, i_scu, refp, scu_x, scu_y, scu_h, EDGE_TYPE_ALL);  // LEFT
        }
    }
}